

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::Start
          (MeshEdgebreakerTraversalPredictiveDecoder *this,DecoderBuffer *out_buffer)

{
  bool bVar1;
  MeshEdgebreakerTraversalDecoder *in_RSI;
  DecoderBuffer *in_RDI;
  value_type_conflict1 *unaff_retaddr;
  size_type in_stack_00000008;
  int32_t num_split_symbols;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  DecoderBuffer *source_buffer;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  source_buffer = in_RDI;
  bVar1 = MeshEdgebreakerTraversalDecoder::Start
                    (in_RSI,(DecoderBuffer *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    bVar1 = DecoderBuffer::Decode<int>
                      (&in_RSI->buffer_,
                       (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if ((bVar1) && (-1 < in_stack_ffffffffffffffe4)) {
      if (in_stack_ffffffffffffffe4 < *(int *)&in_RDI[4].data_) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)out_buffer,in_stack_00000008,unaff_retaddr);
        bVar1 = RAnsBitDecoder::StartDecoding
                          ((RAnsBitDecoder *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           source_buffer);
        if (bVar1) {
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
    if (!MeshEdgebreakerTraversalDecoder::Start(out_buffer)) {
      return false;
    }
    int32_t num_split_symbols;
    if (!out_buffer->Decode(&num_split_symbols) || num_split_symbols < 0)
      return false;
    if (num_split_symbols >= num_vertices_) {
      return false;
    }
    // Set the valences of all initial vertices to 0.
    vertex_valences_.resize(num_vertices_, 0);
    if (!prediction_decoder_.StartDecoding(out_buffer)) {
      return false;
    }
    return true;
  }